

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int call_setter(JSContext *ctx,JSObject *setter,JSValue this_obj,JSValue val,int flags)

{
  JSStackFrame *pJVar1;
  int iVar2;
  JSValue v;
  JSValue JVar3;
  JSValueUnion local_38;
  int64_t local_30;
  
  local_30 = val.tag;
  local_38 = val.u;
  if (setter == (JSObject *)0x0) {
    JS_FreeValue(ctx,val);
    if ((((uint)flags >> 0xe & 1) != 0) ||
       (((iVar2 = 0, (short)flags < 0 &&
         (pJVar1 = ctx->rt->current_stack_frame, pJVar1 != (JSStackFrame *)0x0)) &&
        ((pJVar1->js_mode & 1) != 0)))) {
      JS_ThrowTypeError(ctx,"no setter for property");
      iVar2 = -1;
    }
  }
  else {
    (setter->field_0).header.ref_count = (setter->field_0).header.ref_count + 1;
    JVar3.tag = -1;
    JVar3.u.ptr = setter;
    JVar3 = JS_CallFree(ctx,JVar3,this_obj,1,(JSValue *)&local_38);
    if ((0xfffffff4 < (uint)local_30) &&
       (iVar2 = *local_38.ptr, *(int *)local_38.ptr = iVar2 + -1, iVar2 < 2)) {
      v.tag = local_30;
      v.u.ptr = local_38.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    iVar2 = -1;
    if ((uint)JVar3.tag != 6) {
      if ((0xfffffff4 < (uint)JVar3.tag) &&
         (iVar2 = *JVar3.u.ptr, *(int *)JVar3.u.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar3);
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int call_setter(JSContext *ctx, JSObject *setter,
                       JSValueConst this_obj, JSValue val, int flags)
{
    JSValue ret, func;
    if (likely(setter)) {
        func = JS_MKPTR(JS_TAG_OBJECT, setter);
        /* Note: the field could be removed in the setter */
        func = JS_DupValue(ctx, func);
        ret = JS_CallFree(ctx, func, this_obj, 1, (JSValueConst *)&val);
        JS_FreeValue(ctx, val);
        if (JS_IsException(ret))
            return -1;
        JS_FreeValue(ctx, ret);
        return TRUE;
    } else {
        JS_FreeValue(ctx, val);
        if ((flags & JS_PROP_THROW) ||
            ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
            JS_ThrowTypeError(ctx, "no setter for property");
            return -1;
        }
        return FALSE;
    }
}